

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::~op_queue
          (op_queue<asio::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  reactor_op *prVar2;
  code *pcVar3;
  reactor_op *tmp;
  undefined4 local_30 [2];
  undefined8 local_28;
  
  do {
    prVar1 = this->front_;
    if (prVar1 == (reactor_op *)0x0) {
      return;
    }
    prVar2 = *(reactor_op **)prVar1;
    this->front_ = prVar2;
    if (prVar2 == (reactor_op *)0x0) {
      this->back_ = (reactor_op *)0x0;
    }
    *(long *)prVar1 = 0;
    pcVar3 = *(code **)(prVar1 + 8);
    local_30[0] = 0;
    local_28 = std::_V2::system_category();
    (*pcVar3)(0,prVar1,local_30,0);
  } while (prVar1 != (reactor_op *)0x0);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }